

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O0

void fs_event_cb_dir_multi_file(uv_fs_event_t *handle,char *filename,int events,int status)

{
  int iVar1;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  int status_local;
  int events_local;
  char *filename_local;
  uv_fs_event_t *handle_local;
  
  fs_event_cb_called = fs_event_cb_called + 1;
  if (handle != &fs_event) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0xc5,"handle","==","&fs_event",handle,"==",&fs_event);
    abort();
  }
  if ((long)status == 0) {
    if ((events != 2) && (events != 1)) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
              ,199,"events == UV_CHANGE || events == UV_RENAME");
      abort();
    }
    iVar1 = strncmp(filename,"fsevent-",8);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
              ,0xc9,"strncmp(filename, file_prefix, sizeof(file_prefix) - 1)","==","0",(long)iVar1,
              "==",0);
      abort();
    }
    if (fs_event_created + fs_event_removed == 0x10) {
      iVar1 = uv_timer_start(&timer,fs_event_unlink_files,1,0);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
                ,0xd1,"uv_timer_start(&timer, fs_event_unlink_files, 1, 0)","==","0",(long)iVar1,
                "==",0);
        abort();
      }
    }
    else if (fs_event_cb_called == 0x20) {
      uv_close((uv_handle_t *)&timer,close_cb);
      uv_close((uv_handle_t *)&fs_event,close_cb);
    }
    return;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
          ,0xc6,"status","==","0",(long)status,"==",0);
  abort();
}

Assistant:

static void fs_event_cb_dir_multi_file(uv_fs_event_t* handle,
                                       const char* filename,
                                       int events,
                                       int status) {
  fs_event_cb_called++;
  ASSERT_PTR_EQ(handle, &fs_event);
  ASSERT_OK(status);
  ASSERT(events == UV_CHANGE || events == UV_RENAME);
  #if defined(__APPLE__) || defined(_WIN32) || defined(__linux__)
  ASSERT_OK(strncmp(filename, file_prefix, sizeof(file_prefix) - 1));
  #else
  ASSERT_NE(filename == NULL ||
            strncmp(filename, file_prefix, sizeof(file_prefix) - 1) == 0, 0);
  #endif

  if (fs_event_created + fs_event_removed == fs_event_file_count) {
    /* Once we've processed all create events, delete all files */
    ASSERT_OK(uv_timer_start(&timer, fs_event_unlink_files, 1, 0));
  } else if (fs_event_cb_called == 2 * fs_event_file_count) {
    /* Once we've processed all create and delete events, stop watching */
    uv_close((uv_handle_t*) &timer, close_cb);
    uv_close((uv_handle_t*) handle, close_cb);
  }
}